

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_bneg_h_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar6 [12];
  undefined1 auVar8 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  
  auVar1 = (undefined1  [16])(env->active_fpu).fpr[wt] & _DAT_00d835c0;
  auVar6._0_8_ = CONCAT26(auVar1._10_2_,CONCAT24(auVar1._10_2_,(uint)auVar1._8_2_));
  auVar6._8_2_ = auVar1._12_2_;
  auVar6._10_2_ = auVar1._12_2_;
  auVar7._14_2_ = auVar1._14_2_;
  auVar7._12_2_ = auVar7._14_2_;
  auVar7._0_12_ = auVar6;
  auVar8._0_4_ = (int)(short)(int)(float)((uint)auVar1._8_2_ * 0x800000 + 0x3f800000);
  auVar8._4_4_ = (int)(short)(int)(float)((int)((ulong)auVar6._0_8_ >> 0x20) * 0x800000 + 0x3f800000
                                         );
  auVar8._8_4_ = (int)(short)(int)(float)(auVar6._8_4_ * 0x800000 + 0x3f800000);
  auVar8._12_4_ = (int)(short)(int)(float)(auVar7._12_4_ * 0x800000 + 0x3f800000);
  auVar5._0_12_ = auVar1._0_12_;
  auVar5._12_2_ = auVar1._6_2_;
  auVar5._14_2_ = auVar1._6_2_;
  auVar4._12_4_ = auVar5._12_4_;
  auVar4._0_10_ = auVar1._0_10_;
  auVar4._10_2_ = auVar1._4_2_;
  auVar3._10_6_ = auVar4._10_6_;
  auVar3._0_8_ = auVar1._0_8_;
  auVar3._8_2_ = auVar1._4_2_;
  auVar2._8_8_ = auVar3._8_8_;
  auVar2._6_2_ = auVar1._2_2_;
  auVar2._0_4_ = auVar1._0_4_;
  auVar2._4_2_ = auVar1._2_2_;
  auVar1._0_4_ = (int)(short)(int)(float)(auVar2._0_4_ * 0x800000 + 0x3f800000);
  auVar1._4_4_ = (int)(short)(int)(float)(auVar2._4_4_ * 0x800000 + 0x3f800000);
  auVar1._8_4_ = (int)(short)(int)(float)(auVar3._8_4_ * 0x800000 + 0x3f800000);
  auVar1._12_4_ = (int)(short)(int)(float)(auVar4._12_4_ * 0x800000 + 0x3f800000);
  auVar1 = packssdw(auVar1,auVar8);
  (env->active_fpu).fpr[wd] = (fpr_t)(auVar1 ^ (undefined1  [16])(env->active_fpu).fpr[ws]);
  return;
}

Assistant:

void helper_msa_bneg_h(CPUMIPSState *env, uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_bneg_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_bneg_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_bneg_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_bneg_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_bneg_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_bneg_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_bneg_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_bneg_df(DF_HALF, pws->h[7],  pwt->h[7]);
}